

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FloorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_floor(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  FloorLayerParams *pFVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_floor(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_floor(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pFVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::FloorLayerParams>(arena);
    (this->layer_).floor_ = pFVar2;
  }
  return (FloorLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FloorLayerParams* NeuralNetworkLayer::_internal_mutable_floor() {
  if (!_internal_has_floor()) {
    clear_layer();
    set_has_floor();
    layer_.floor_ = CreateMaybeMessage< ::CoreML::Specification::FloorLayerParams >(GetArenaForAllocation());
  }
  return layer_.floor_;
}